

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

Ptr __thiscall
hwnet::TCPSocket::SetSendTimeoutCallback
          (TCPSocket *this,milliseconds timeout,SendTimeoutCallback *callback)

{
  bool bVar1;
  element_type *this_00;
  mutex_type *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar2;
  undefined1 local_50 [8];
  shared_ptr<hwnet::util::Timer> sp;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> guard;
  SendTimeoutCallback *callback_local;
  milliseconds timeout_local;
  TCPSocket *this_local;
  
  guard._M_device = in_RCX;
  std::lock_guard<std::mutex>::lock_guard(&local_30,(mutex_type *)(timeout + 0x938));
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)(timeout + 0x928));
  if (!bVar1) {
    *(undefined8 *)(timeout + 0xad8) = 0;
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
              ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)(timeout + 0xae0),
               (nullptr_t)0x0);
    if ((callback == (SendTimeoutCallback *)0x0) ||
       (bVar1 = std::function::operator_cast_to_bool((function *)guard._M_device), !bVar1)) {
      if (*(long *)(timeout + 0xaa8) == 0) {
        std::weak_ptr<hwnet::util::Timer>::lock((weak_ptr<hwnet::util::Timer> *)local_50);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
        if (bVar1) {
          this_00 = std::
                    __shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_50);
          util::Timer::cancel(this_00);
          std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::reset
                    ((__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)(timeout + 0xa98)
                    );
        }
        std::shared_ptr<hwnet::util::Timer>::~shared_ptr((shared_ptr<hwnet::util::Timer> *)local_50)
        ;
      }
    }
    else {
      *(SendTimeoutCallback **)(timeout + 0xad8) = callback;
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)(timeout + 0xae0),
                 (function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)guard._M_device);
      registerTimer((TCPSocket *)timeout,1);
    }
  }
  std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this
            ((enable_shared_from_this<hwnet::TCPSocket> *)this);
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  PVar2.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr)PVar2.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TCPSocket::Ptr TCPSocket::SetSendTimeoutCallback(util::milliseconds timeout, const SendTimeoutCallback &callback) {
	std::lock_guard<std::mutex> guard(this->mtx);
	if(!this->closed) {	
		this->sendTimeout = 0;
		this->sendTimeoutCallback_ = nullptr;

		if(timeout > 0 && callback) {
			this->sendTimeout = timeout;
			this->sendTimeoutCallback_ = callback;			
			this->registerTimer(timerSend);
		} else if(this->recvTimeout == 0) {
			if(auto sp = this->timer.lock()) {
				sp->cancel();
				this->timer.reset();
			}		
		}
	}

	return shared_from_this();
}